

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Armijo.cpp
# Opt level: O1

RealType __thiscall
QuantLib::ArmijoLineSearch::operator()
          (ArmijoLineSearch *this,Problem *P,Type *ecType,EndCriteria *endCriteria,RealType t_ini)

{
  DynamicVector<double,_std::allocator<double>_> *pDVar1;
  DynamicVector<double,_std::allocator<double>_> *pDVar2;
  DynamicVector<double,_std::allocator<double>_> *direction;
  bool bVar3;
  size_t iteration;
  RealType RVar4;
  RealType extraout_XMM0_Qa;
  RealType extraout_XMM0_Qa_00;
  double dVar5;
  double local_88;
  allocator_type local_79;
  RealType local_78;
  Constraint *local_70;
  DynamicVector<double,_std::allocator<double>_> *local_68;
  Type *local_60;
  EndCriteria *local_58;
  RealType local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_70 = P->constraint_;
  (this->super_LineSearch).succeed_ = true;
  local_78 = P->functionValue_;
  RVar4 = P->squaredNorm_;
  (this->super_LineSearch).qt_ = local_78;
  pDVar1 = &(this->super_LineSearch).gradient_;
  local_60 = ecType;
  local_58 = endCriteria;
  if ((this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    RVar4 = Problem::DotProduct(P,pDVar1,&(this->super_LineSearch).searchDirection_);
    RVar4 = -RVar4;
  }
  (this->super_LineSearch).qpt_ = RVar4;
  pDVar2 = &P->currentValue_;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_79);
  local_68 = pDVar1;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&pDVar1->data_,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pDVar1 = &(this->super_LineSearch).xtd_;
  std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&pDVar2->data_);
  direction = &(this->super_LineSearch).searchDirection_;
  local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,direction,t_ini,local_70);
  P->functionEvaluation_ = P->functionEvaluation_ + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[2])(P->objectiveFunction_,pDVar1);
  P->functionValue_ = extraout_XMM0_Qa;
  (*P->statusFunction_->_vptr_StatusFunction[2])
            (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
             (ulong)(uint)P->gradientEvaluation_,pDVar2);
  dVar5 = P->functionValue_;
  (this->super_LineSearch).qt_ = dVar5;
  if (dVar5 - local_78 <= -this->alpha_ * local_88 * (this->super_LineSearch).qpt_) {
    bVar3 = false;
LAB_002059af:
    pDVar2 = local_68;
    if (bVar3 != false) {
      (this->super_LineSearch).succeed_ = false;
    }
    P->gradientEvaluation_ = P->gradientEvaluation_ + 1;
    (*P->objectiveFunction_->_vptr_ObjectiveFunction[3])(P->objectiveFunction_,local_68,pDVar1);
    RVar4 = Problem::DotProduct(P,pDVar2,pDVar2);
    (this->super_LineSearch).qpt_ = RVar4;
    return local_88;
  }
  iteration = 1;
  do {
    dVar5 = this->beta_;
    local_50 = (this->super_LineSearch).qt_;
    std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&pDVar2->data_);
    local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,direction,local_88 * dVar5,local_70
                                 );
    P->functionEvaluation_ = P->functionEvaluation_ + 1;
    (*P->objectiveFunction_->_vptr_ObjectiveFunction[2])(P->objectiveFunction_,pDVar1);
    P->functionValue_ = extraout_XMM0_Qa_00;
    (*P->statusFunction_->_vptr_StatusFunction[2])
              (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
               (ulong)(uint)P->gradientEvaluation_,pDVar2);
    (this->super_LineSearch).qt_ = P->functionValue_;
    P->gradientEvaluation_ = P->gradientEvaluation_ + 1;
    (*P->objectiveFunction_->_vptr_ObjectiveFunction[3])(P->objectiveFunction_,local_68,pDVar1);
    bVar3 = EndCriteria::checkMaxIterations(local_58,iteration,local_60);
    dVar5 = -this->alpha_ * local_88 * (this->super_LineSearch).qpt_;
    if ((this->super_LineSearch).qt_ - local_78 <= dVar5) {
      if (bVar3 || dVar5 / this->beta_ < local_50 - local_78) goto LAB_002059af;
    }
    else if (bVar3) goto LAB_002059af;
    iteration = iteration + 1;
  } while( true );
}

Assistant:

RealType ArmijoLineSearch::operator()(Problem& P, EndCriteria::Type& ecType,
                                        const EndCriteria& endCriteria,
                                        const RealType t_ini) {
    // OptimizationMethod& method = P.method();
    Constraint& constraint = P.constraint();
    succeed_               = true;
    bool maxIter           = false;
    RealType qtold, t = t_ini;
    size_t loopNumber = 0;

    RealType q0  = P.functionValue();
    RealType qp0 = P.gradientNormValue();

    qt_ = q0;
    qpt_ =
        (gradient_.empty()) ? qp0 : -P.DotProduct(gradient_, searchDirection_);

    // Initialize gradient
    gradient_ = DynamicVector<RealType>(P.currentValue().size());
    // Compute new point
    xtd_ = P.currentValue();
    t    = update(xtd_, searchDirection_, t, constraint);
    // Compute function value at the new point
    qt_ = P.value(xtd_);

    // Enter in the loop if the criterion is not satisfied
    if ((qt_ - q0) > -alpha_ * t * qpt_) {
      do {
        loopNumber++;
        // Decrease step
        t *= beta_;
        // Store old value of the function
        qtold = qt_;
        // New point value
        xtd_ = P.currentValue();
        t    = update(xtd_, searchDirection_, t, constraint);

        // Compute function value at the new point
        qt_ = P.value(xtd_);
        P.gradient(gradient_, xtd_);
        // and it squared norm
        maxIter = endCriteria.checkMaxIterations(loopNumber, ecType);
      } while ((((qt_ - q0) > (-alpha_ * t * qpt_)) ||
                ((qtold - q0) <= (-alpha_ * t * qpt_ / beta_))) &&
               (!maxIter));
    }

    if (maxIter) succeed_ = false;

    // Compute new gradient
    P.gradient(gradient_, xtd_);
    // and it squared norm
    // qpt_ = P.computeGradientNormValue(gradient_);
    qpt_ = P.DotProduct(gradient_, gradient_);

    // Return new step value
    return t;
  }